

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::slash(Forth *this)

{
  allocator<char> local_39;
  string local_38;
  uint local_18;
  uint local_14;
  SCell n1;
  SCell n2;
  Forth *this_local;
  
  _n1 = this;
  requireDStackDepth(this,2,"/");
  local_14 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  local_18 = ForthStack<unsigned_int>::getTop(&this->dStack);
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"/: zero divisor",&local_39);
    throwCppExceptionMessage(this,&local_38,errorDivisionByZero);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,(int)local_18 / (int)local_14);
  return;
}

Assistant:

void slash() {
			REQUIRE_DSTACK_DEPTH(2, "/");
			auto n2 = static_cast<SCell>(dStack.getTop()); pop();
			auto n1 = static_cast<SCell>(dStack.getTop());
			RUNTIME_ERROR_IF(n2 == 0, "/: zero divisor",errorDivisionByZero);
			dStack.setTop(static_cast<Cell>(n1 / n2));
		}